

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

char * varinfo(lua_State *L,TValue *o)

{
  CallInfo *ci;
  lua_CFunction p_Var1;
  StkId pTVar2;
  Proto *p;
  int lastpc;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  char *local_20;
  
  local_20 = (char *)0x0;
  ci = L->ci;
  if ((ci->callstatus & 2) != 0) {
    p_Var1 = (ci->func->value_).f;
    for (lVar4 = 0; (ulong)(byte)p_Var1[10] * 8 != lVar4; lVar4 = lVar4 + 8) {
      if ((TValue *)**(long **)(p_Var1 + lVar4 + 0x20) == o) {
        lVar4 = *(long *)(*(long *)(*(long *)(p_Var1 + 0x18) + 0x58) + lVar4 * 2);
        pcVar3 = "?";
        if (lVar4 != 0) {
          pcVar3 = (char *)(lVar4 + 0x18);
        }
        pcVar5 = "upvalue";
        goto LAB_00107b1e;
      }
    }
    pTVar2 = (ci->u).l.base;
    uVar6 = (long)o - (long)pTVar2;
    if ((-1 < (long)uVar6) && ((long)uVar6 < (long)ci->top - (long)pTVar2)) {
      p = *(Proto **)(p_Var1 + 0x18);
      lastpc = currentpc(ci);
      pcVar5 = getobjname(p,lastpc,(int)(uVar6 >> 4),&local_20);
      pcVar3 = local_20;
      if (pcVar5 != (char *)0x0) {
LAB_00107b1e:
        pcVar3 = luaO_pushfstring(L," (%s \'%s\')",pcVar5,pcVar3);
        return pcVar3;
      }
    }
  }
  return "";
}

Assistant:

static const char *varinfo (lua_State *L, const TValue *o) {
  const char *name = NULL;  /* to avoid warnings */
  CallInfo *ci = L->ci;
  const char *kind = NULL;
  if (isLua(ci)) {
    kind = getupvalname(ci, o, &name);  /* check whether 'o' is an upvalue */
    if (!kind && isinstack(ci, o))  /* no? try a register */
      kind = getobjname(ci_func(ci)->p, currentpc(ci),
                        cast_int(o - ci->u.l.base), &name);
  }
  return (kind) ? luaO_pushfstring(L, " (%s '%s')", kind, name) : "";
}